

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O3

int Gia_ManCombMarkUsed(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar3 = (ulong)(uint)p->nObjs;
  if ((0 < p->nObjs) && (pGVar8 = p->pObjs, pGVar8 != (Gia_Obj_t *)0x0)) {
    lVar6 = 0;
    do {
      uVar3 = *(ulong *)pGVar8;
      uVar1 = (uint)uVar3;
      if ((~uVar1 & 0x1fffffff) == 0 || (int)uVar1 < 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)((uint)((uVar1 & 0x1fffffff) != ((uint)(uVar3 >> 0x20) & 0x1fffffff)) << 0x1e
                       );
        if ((uVar1 & 0x1fffffff) == 0x1fffffff) {
          uVar9 = 0x40000000;
        }
      }
      *(ulong *)pGVar8 = uVar3 & 0xffffffffbfffffff | uVar9;
      lVar6 = lVar6 + 1;
      uVar3 = (ulong)p->nObjs;
    } while ((lVar6 < (long)uVar3) && (pGVar8 = p->pObjs + lVar6, p->pObjs != (Gia_Obj_t *)0x0));
  }
  iVar7 = 0;
  uVar1 = 0;
  if (p->nBufs == 0) {
    uVar1 = (uint)uVar3;
  }
  if ((int)uVar1 < (int)(uint)uVar3) {
    lVar6 = (ulong)uVar1 * 0xc;
    iVar7 = 0;
    uVar10 = uVar1;
    do {
      if ((int)uVar1 < 0) goto LAB_002243f3;
      pGVar8 = p->pObjs;
      if (pGVar8 == (Gia_Obj_t *)0x0) break;
      uVar5 = (uint)*(undefined8 *)(&pGVar8->field_0x0 + lVar6);
      if (((-1 < (int)uVar5) && ((uVar5 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar5 & 0x1fffffff) ==
          ((uint)((ulong)*(undefined8 *)(&pGVar8->field_0x0 + lVar6) >> 0x20) & 0x1fffffff))) {
        iVar2 = Gia_ManCombMarkUsed_rec
                          (p,(Gia_Obj_t *)
                             ((long)pGVar8 + lVar6 + (ulong)((uVar5 & 0x1fffffff) << 2) * -3));
        iVar7 = iVar7 + iVar2;
        uVar3 = (ulong)(uint)p->nObjs;
      }
      lVar6 = lVar6 + 0xc;
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < (int)uVar3);
  }
  pVVar4 = p->vCos;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      iVar2 = pVVar4->pArray[lVar6];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_002243f3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return iVar7;
      }
      pGVar8 = p->pObjs + iVar2;
      iVar2 = Gia_ManCombMarkUsed_rec(p,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff))
      ;
      iVar7 = iVar7 + iVar2;
      lVar6 = lVar6 + 1;
      pVVar4 = p->vCos;
    } while (lVar6 < pVVar4->nSize);
  }
  return iVar7;
}

Assistant:

int Gia_ManCombMarkUsed( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = Gia_ObjIsAnd(pObj) && !Gia_ObjIsBuf(pObj);
    Gia_ManForEachBuf( p, pObj, i )
        nNodes += Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        nNodes += Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) );
    return nNodes;
}